

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void releaseMemArray(Mem *p,int N)

{
  u8 uVar1;
  sqlite3 *db_00;
  u8 malloc_failed;
  sqlite3 *db;
  Mem *pEnd;
  Mem *pMStack_10;
  int N_local;
  Mem *p_local;
  
  if ((p != (Mem *)0x0) && (N != 0)) {
    db_00 = p->db;
    uVar1 = db_00->mallocFailed;
    pMStack_10 = p;
    if (db_00->pnBytesFreed == (int *)0x0) {
      for (; pMStack_10 < p + N; pMStack_10 = pMStack_10 + 1) {
        if ((pMStack_10->flags & 0x2460) == 0) {
          if (pMStack_10->zMalloc != (char *)0x0) {
            sqlite3DbFree(db_00,pMStack_10->zMalloc);
            pMStack_10->zMalloc = (char *)0x0;
          }
        }
        else {
          sqlite3VdbeMemRelease(pMStack_10);
        }
        pMStack_10->flags = 0x80;
      }
      db_00->mallocFailed = uVar1;
    }
    else {
      for (; pMStack_10 < p + N; pMStack_10 = pMStack_10 + 1) {
        sqlite3DbFree(db_00,pMStack_10->zMalloc);
      }
    }
  }
  return;
}

Assistant:

static void releaseMemArray(Mem *p, int N){
  if( p && N ){
    Mem *pEnd;
    sqlite3 *db = p->db;
    u8 malloc_failed = db->mallocFailed;
    if( db->pnBytesFreed ){
      for(pEnd=&p[N]; p<pEnd; p++){
        sqlite3DbFree(db, p->zMalloc);
      }
      return;
    }
    for(pEnd=&p[N]; p<pEnd; p++){
      assert( (&p[1])==pEnd || p[0].db==p[1].db );

      /* This block is really an inlined version of sqlite3VdbeMemRelease()
      ** that takes advantage of the fact that the memory cell value is 
      ** being set to NULL after releasing any dynamic resources.
      **
      ** The justification for duplicating code is that according to 
      ** callgrind, this causes a certain test case to hit the CPU 4.7 
      ** percent less (x86 linux, gcc version 4.1.2, -O6) than if 
      ** sqlite3MemRelease() were called from here. With -O2, this jumps
      ** to 6.6 percent. The test case is inserting 1000 rows into a table 
      ** with no indexes using a single prepared INSERT statement, bind() 
      ** and reset(). Inserts are grouped into a transaction.
      */
      if( p->flags&(MEM_Agg|MEM_Dyn|MEM_Frame|MEM_RowSet) ){
        sqlite3VdbeMemRelease(p);
      }else if( p->zMalloc ){
        sqlite3DbFree(db, p->zMalloc);
        p->zMalloc = 0;
      }

      p->flags = MEM_Invalid;
    }
    db->mallocFailed = malloc_failed;
  }
}